

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

string_view __thiscall
google::protobuf::Reflection::ScratchSpace::CopyFromCord(ScratchSpace *this,Cord *cord)

{
  byte bVar1;
  Nonnull<CordRep_*> rep;
  bool bVar2;
  size_t sVar3;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  char *pcVar5;
  string_view sVar6;
  string_view fragment;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  rep = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (rep == (Nonnull<CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    pcVar5 = (char *)0x0;
    if ((bVar1 & 1) == 0) {
      sVar3 = (ulong)(long)(char)bVar1 >> 1;
      pcVar5 = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
    }
    else {
      sVar3 = rep->length;
    }
    bVar2 = false;
  }
  else {
    local_28._M_len = 0;
    local_28._M_str = (char *)0x0;
    bVar2 = absl::lts_20250127::Cord::GetFlatAux(rep,&local_28);
    bVar2 = !bVar2;
    sVar3 = local_28._M_len;
    pcVar5 = local_28._M_str;
  }
  if (bVar2) {
    if ((this->buffer_)._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var4._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
      (_Var4._M_head_impl)->_M_dataplus = (_Alloc_hider)&(_Var4._M_head_impl)->field_2;
      (_Var4._M_head_impl)->_M_string_length = 0;
      ((_Var4._M_head_impl)->field_2)._M_local_buf[0] = '\0';
      (this->buffer_)._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl = _Var4._M_head_impl;
    }
    absl::lts_20250127::CopyCordToString
              (cord,(this->buffer_)._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl);
    _Var4._M_head_impl =
         (this->buffer_)._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    pcVar5 = ((_Var4._M_head_impl)->_M_dataplus)._M_p;
    sVar3 = (_Var4._M_head_impl)->_M_string_length;
  }
  sVar6._M_str = pcVar5;
  sVar6._M_len = sVar3;
  return sVar6;
}

Assistant:

absl::string_view CopyFromCord(const absl::Cord& cord) {
      if (absl::optional<absl::string_view> flat = cord.TryFlat()) {
        return *flat;
      }
      if (!buffer_) {
        buffer_ = absl::make_unique<std::string>();
      }
      absl::CopyCordToString(cord, buffer_.get());
      return *buffer_;
    }